

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O2

void __thiscall VariableEffect::~VariableEffect(VariableEffect *this)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  
  if (this->_pEffect != (Effect *)0x0) {
    (**(code **)(*(long *)this->_pEffect + 8))();
  }
  for (p_Var1 = (this->_mapVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_mapVariables)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(void **)(p_Var1 + 2) != (void *)0x0) {
      operator_delete(*(void **)(p_Var1 + 2));
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  ::~_Rb_tree(&(this->_mapVariables)._M_t);
  return;
}

Assistant:

~VariableEffect()
	{
		if(_pEffect)
			delete _pEffect;
		MapVariables::iterator iterVars;
		for(iterVars = _mapVariables.begin(); iterVars != _mapVariables.end(); iterVars++)
			if(iterVars->second)
				delete iterVars->second;
	}